

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

void sf_base64decode(sf_vec *dest,sf_vec *src)

{
  undefined1 uVar1;
  byte *pbVar3;
  undefined1 *puVar4;
  long *in_RSI;
  long *in_RDI;
  int idx;
  size_t i;
  uint32_t n;
  uint8_t *end;
  uint8_t *p;
  uint8_t *o;
  ulong local_38;
  int local_2c;
  byte *local_20;
  undefined1 *local_18;
  undefined1 uVar2;
  
  if ((in_RSI[1] & 3U) != 0) {
    __assert_fail("(src->len & 0x3) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x44a,"void sf_base64decode(sf_vec *, const sf_vec *)");
  }
  if (in_RSI[1] == 0) {
    *in_RDI = *in_RSI;
    in_RDI[1] = in_RSI[1];
  }
  else {
    local_18 = (undefined1 *)*in_RDI;
    local_20 = (byte *)*in_RSI;
    pbVar3 = (byte *)(*in_RSI + in_RSI[1]);
    while (local_20 != pbVar3) {
      local_2c = 0;
      local_38 = 1;
      while( true ) {
        uVar1 = (undefined1)((uint)local_2c >> 8);
        uVar2 = (undefined1)((uint)local_2c >> 0x10);
        if (4 < local_38) break;
        if (sf_base64decode::index_tbl[*local_20] == -1) {
          if (local_38 < 3) {
            __assert_fail("i > 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                          ,0x45d,"void sf_base64decode(sf_vec *, const sf_vec *)");
          }
          if (local_38 == 3) {
            if (((*local_20 != 0x3d) || (local_20[1] != 0x3d)) || (local_20 + 2 != pbVar3)) {
              __assert_fail("*p == \'=\' && *(p + 1) == \'=\' && p + 2 == end",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                            ,0x460,"void sf_base64decode(sf_vec *, const sf_vec *)");
            }
            *local_18 = uVar2;
            local_18 = local_18 + 1;
          }
          else {
            if ((*local_20 != 0x3d) || (local_20 + 1 != pbVar3)) {
              __assert_fail("*p == \'=\' && p + 1 == end",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                            ,0x467,"void sf_base64decode(sf_vec *, const sf_vec *)");
            }
            puVar4 = local_18 + 1;
            *local_18 = uVar2;
            local_18 = local_18 + 2;
            *puVar4 = uVar1;
          }
          goto LAB_00129dd8;
        }
        local_2c = (sf_base64decode::index_tbl[*local_20] << ((char)local_38 * -6 + 0x18U & 0x1f)) +
                   local_2c;
        local_38 = local_38 + 1;
        local_20 = local_20 + 1;
      }
      *local_18 = uVar2;
      puVar4 = local_18 + 2;
      local_18[1] = uVar1;
      local_18 = local_18 + 3;
      *puVar4 = (char)local_2c;
    }
LAB_00129dd8:
    in_RDI[1] = (long)local_18 - *in_RDI;
  }
  return;
}

Assistant:

void sf_base64decode(sf_vec *dest, const sf_vec *src) {
  static const int index_tbl[] = {
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, 62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60,
    61, -1, -1, -1, -1, -1, -1, -1, 0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10,
    11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1,
    -1, -1, 26, 27, 28, 29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42,
    43, 44, 45, 46, 47, 48, 49, 50, 51, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1, -1};
  uint8_t *o;
  const uint8_t *p, *end;
  uint32_t n;
  size_t i;
  int idx;

  assert((src->len & 0x3) == 0);

  if (src->len == 0) {
    *dest = *src;

    return;
  }

  o = dest->base;
  p = src->base;
  end = src->base + src->len;

  for (; p != end;) {
    n = 0;

    for (i = 1; i <= 4; ++i, ++p) {
      idx = index_tbl[*p];

      if (idx == -1) {
        assert(i > 2);

        if (i == 3) {
          assert(*p == '=' && *(p + 1) == '=' && p + 2 == end);

          *o++ = (uint8_t)(n >> 16);

          goto fin;
        }

        assert(*p == '=' && p + 1 == end);

        *o++ = (uint8_t)(n >> 16);
        *o++ = (n >> 8) & 0xffu;

        goto fin;
      }

      n += (uint32_t)(idx << (24 - i * 6));
    }

    *o++ = (uint8_t)(n >> 16);
    *o++ = (n >> 8) & 0xffu;
    *o++ = n & 0xffu;
  }

fin:
  dest->len = (size_t)(o - dest->base);
}